

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::InitializeValidityMask
               (data_ptr_t *row_locations,idx_t append_count,idx_t validity_bytes)

{
  data_ptr_t pdVar1;
  idx_t i;
  idx_t i_8;
  idx_t iVar2;
  
  switch(validity_bytes) {
  case 1:
    for (iVar2 = 0; append_count != iVar2; iVar2 = iVar2 + 1) {
      *row_locations[iVar2] = 0xff;
    }
    break;
  case 2:
    for (iVar2 = 0; append_count != iVar2; iVar2 = iVar2 + 1) {
      pdVar1 = row_locations[iVar2];
      pdVar1[0] = 0xff;
      pdVar1[1] = 0xff;
    }
    break;
  case 3:
    for (iVar2 = 0; append_count != iVar2; iVar2 = iVar2 + 1) {
      pdVar1 = row_locations[iVar2];
      pdVar1[2] = 0xff;
      pdVar1[0] = 0xff;
      pdVar1[1] = 0xff;
    }
    break;
  case 4:
    for (iVar2 = 0; append_count != iVar2; iVar2 = iVar2 + 1) {
      pdVar1 = row_locations[iVar2];
      pdVar1[0] = 0xff;
      pdVar1[1] = 0xff;
      pdVar1[2] = 0xff;
      pdVar1[3] = 0xff;
    }
    break;
  case 5:
    for (iVar2 = 0; append_count != iVar2; iVar2 = iVar2 + 1) {
      pdVar1 = row_locations[iVar2];
      pdVar1[4] = 0xff;
      pdVar1[0] = 0xff;
      pdVar1[1] = 0xff;
      pdVar1[2] = 0xff;
      pdVar1[3] = 0xff;
    }
    break;
  case 6:
    for (iVar2 = 0; append_count != iVar2; iVar2 = iVar2 + 1) {
      pdVar1 = row_locations[iVar2];
      pdVar1[4] = 0xff;
      pdVar1[5] = 0xff;
      pdVar1[0] = 0xff;
      pdVar1[1] = 0xff;
      pdVar1[2] = 0xff;
      pdVar1[3] = 0xff;
    }
    break;
  case 7:
    for (iVar2 = 0; append_count != iVar2; iVar2 = iVar2 + 1) {
      pdVar1 = row_locations[iVar2];
      pdVar1[3] = 0xff;
      pdVar1[4] = 0xff;
      pdVar1[5] = 0xff;
      pdVar1[6] = 0xff;
      pdVar1[0] = 0xff;
      pdVar1[1] = 0xff;
      pdVar1[2] = 0xff;
      pdVar1[3] = 0xff;
    }
    break;
  case 8:
    for (iVar2 = 0; append_count != iVar2; iVar2 = iVar2 + 1) {
      pdVar1 = row_locations[iVar2];
      pdVar1[0] = 0xff;
      pdVar1[1] = 0xff;
      pdVar1[2] = 0xff;
      pdVar1[3] = 0xff;
      pdVar1[4] = 0xff;
      pdVar1[5] = 0xff;
      pdVar1[6] = 0xff;
      pdVar1[7] = 0xff;
    }
    break;
  default:
    for (iVar2 = 0; append_count != iVar2; iVar2 = iVar2 + 1) {
      FastMemset(row_locations[iVar2],-1,validity_bytes);
    }
  }
  return;
}

Assistant:

static void InitializeValidityMask(const data_ptr_t row_locations[], const idx_t append_count,
                                   const idx_t validity_bytes) {
	switch (validity_bytes) {
	case 1:
		TemplatedInitializeValidityMask<uint8_t>(row_locations, append_count);
		break;
	case 2:
		TemplatedInitializeValidityMask<uint16_t>(row_locations, append_count);
		break;
	case 3:
		TemplatedInitializeValidityMask<3>(row_locations, append_count);
		break;
	case 4:
		TemplatedInitializeValidityMask<uint32_t>(row_locations, append_count);
		break;
	case 5:
		TemplatedInitializeValidityMask<5>(row_locations, append_count);
		break;
	case 6:
		TemplatedInitializeValidityMask<6>(row_locations, append_count);
		break;
	case 7:
		TemplatedInitializeValidityMask<7>(row_locations, append_count);
		break;
	case 8:
		TemplatedInitializeValidityMask<uint64_t>(row_locations, append_count);
		break;
	default:
		for (idx_t i = 0; i < append_count; i++) {
			FastMemset(row_locations[i], ~0, validity_bytes);
		}
	}
}